

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O2

int get_seek_page_info(stb_vorbis *f,ProbedPage *z)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint8 header [27];
  uint8 lacing [255];
  
  uVar1 = stb_vorbis_get_file_offset(f);
  z->page_start = uVar1;
  getn(f,header,0x1b);
  iVar2 = 0;
  if (header._0_4_ == 0x5367674f) {
    getn(f,lacing,(uint)header[0x1a]);
    iVar2 = 0;
    for (uVar3 = 0; header[0x1a] != uVar3; uVar3 = uVar3 + 1) {
      iVar2 = iVar2 + (uint)lacing[uVar3];
    }
    z->page_end = z->page_start + iVar2 + (uint)header[0x1a] + 0x1b;
    z->last_decoded_sample = header._6_4_;
    set_file_offset(f,z->page_start);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int get_seek_page_info(stb_vorbis *f, ProbedPage *z)
{
   uint8 header[27], lacing[255];
   int i,len;

   // record where the page starts
   z->page_start = stb_vorbis_get_file_offset(f);

   // parse the header
   getn(f, header, 27);
   if (header[0] != 'O' || header[1] != 'g' || header[2] != 'g' || header[3] != 'S')
      return 0;
   getn(f, lacing, header[26]);

   // determine the length of the payload
   len = 0;
   for (i=0; i < header[26]; ++i)
      len += lacing[i];

   // this implies where the page ends
   z->page_end = z->page_start + 27 + header[26] + len;

   // read the last-decoded sample out of the data
   z->last_decoded_sample = header[6] + (header[7] << 8) + (header[8] << 16) + (header[9] << 24);

   // restore file state to where we were
   set_file_offset(f, z->page_start);
   return 1;
}